

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_set_rollback(filemgr *file,uint8_t new_val)

{
  undefined3 in_register_00000031;
  
  pthread_spin_lock(&file->lock);
  file->fflags = (CONCAT31(in_register_00000031,new_val) != 0) << 2 | file->fflags & 0xfb;
  pthread_spin_unlock(&file->lock);
  return;
}

Assistant:

void filemgr_set_rollback(struct filemgr *file, uint8_t new_val)
{
    spin_lock(&file->lock);
    if (new_val) {
        file->fflags |= FILEMGR_ROLLBACK_IN_PROG;
    } else {
        file->fflags &= ~FILEMGR_ROLLBACK_IN_PROG;
    }
    spin_unlock(&file->lock);
}